

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_DecodePCM24
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  long lVar3;
  byte *pbVar4;
  ulong uVar5;
  FAudioWaveFormatEx *pFVar6;
  
  if (samples != 0) {
    puVar1 = buffer->pAudioData +
             (uint)((voice->field_19).src.format)->nBlockAlign *
             (voice->field_19).src.curBufferOffset;
    uVar2 = 0;
    do {
      pFVar6 = (voice->field_19).src.format;
      if (pFVar6->nChannels != 0) {
        pbVar4 = puVar1 + 2;
        lVar3 = 0;
        uVar5 = 0;
        do {
          decodeCache[uVar5] =
               (float)((int)((uint)pbVar4[-2] << 8 |
                            (uint)pbVar4[-1] << 0x10 | (uint)*pbVar4 << 0x18) >> 8) / 8388607.0;
          uVar5 = uVar5 + 1;
          pFVar6 = (voice->field_19).src.format;
          pbVar4 = pbVar4 + 3;
          lVar3 = lVar3 + 4;
        } while (uVar5 < pFVar6->nChannels);
        decodeCache = (float *)((long)decodeCache + lVar3);
      }
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + pFVar6->nBlockAlign;
    } while (uVar2 != samples);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM24(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	uint32_t i, j;
	const uint8_t *buf;
	LOG_FUNC_ENTER(voice->audio)

	/* FIXME: Uh... is this something that can be SIMD-ified? */
	buf = buffer->pAudioData + (
		voice->src.curBufferOffset * voice->src.format->nBlockAlign
	);
	for (i = 0; i < samples; i += 1, buf += voice->src.format->nBlockAlign)
	for (j = 0; j < voice->src.format->nChannels; j += 1)
	{
		*decodeCache++ = ((int32_t) (
			((uint32_t) buf[(j * 3) + 2] << 24) |
			((uint32_t) buf[(j * 3) + 1] << 16) |
			((uint32_t) buf[(j * 3) + 0] << 8)
		) >> 8) / 8388607.0f;
	}

	LOG_FUNC_EXIT(voice->audio)
}